

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_argv.cc
# Opt level: O0

void __thiscall anon_unknown.dwarf_2894c1::ArgParser::argCopyright(ArgParser *this)

{
  element_type *peVar1;
  element_type *this_00;
  Pipeline *pPVar2;
  Pipeline *this_01;
  string *str;
  string local_60;
  shared_ptr<QPDFLogger> local_30;
  QPDFLogger local_20;
  ArgParser *local_10;
  ArgParser *this_local;
  
  local_10 = this;
  QPDFLogger::defaultLogger();
  peVar1 = std::__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &local_30);
  QPDFLogger::getInfo(&local_20,SUB81(peVar1,0));
  this_00 = std::__shared_ptr_access<Pipeline,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                      ((__shared_ptr_access<Pipeline,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       &local_20);
  QPDFArgParser::getProgname_abi_cxx11_(&local_60,&this->ap);
  pPVar2 = Pipeline::operator<<(this_00,&local_60);
  this_01 = Pipeline::operator<<(pPVar2," version ");
  str = (string *)QPDF::QPDFVersion_abi_cxx11_((QPDF *)pPVar2);
  pPVar2 = Pipeline::operator<<(this_01,str);
  pPVar2 = Pipeline::operator<<(pPVar2,"\n");
  pPVar2 = Pipeline::operator<<(pPVar2,"\n");
  pPVar2 = Pipeline::operator<<(pPVar2,"Copyright (c) 2005-2021 Jay Berkenbilt\n");
  pPVar2 = Pipeline::operator<<
                     (pPVar2,"Copyright (c) 2022-2025 Jay Berkenbilt and Manfred Holger\n");
  pPVar2 = Pipeline::operator<<(pPVar2,"\n");
  pPVar2 = Pipeline::operator<<
                     (pPVar2,
                      "qpdf is licensed under the Apache License, Version 2.0 (the \"License\");\n")
  ;
  pPVar2 = Pipeline::operator<<
                     (pPVar2,"you may not use this file except in compliance with the License.\n");
  pPVar2 = Pipeline::operator<<(pPVar2,"You may obtain a copy of the License at\n");
  pPVar2 = Pipeline::operator<<(pPVar2,"\n");
  pPVar2 = Pipeline::operator<<(pPVar2,"  http://www.apache.org/licenses/LICENSE-2.0\n");
  pPVar2 = Pipeline::operator<<(pPVar2,"\n");
  pPVar2 = Pipeline::operator<<
                     (pPVar2,"Unless required by applicable law or agreed to in writing, software\n"
                     );
  pPVar2 = Pipeline::operator<<
                     (pPVar2,"distributed under the License is distributed on an \"AS IS\" BASIS,\n"
                     );
  pPVar2 = Pipeline::operator<<
                     (pPVar2,
                      "WITHOUT WARRANTIES OR CONDITIONS OF ANY KIND, either express or implied.\n");
  pPVar2 = Pipeline::operator<<
                     (pPVar2,"See the License for the specific language governing permissions and\n"
                     );
  pPVar2 = Pipeline::operator<<(pPVar2,"limitations under the License.\n");
  pPVar2 = Pipeline::operator<<(pPVar2,"\n");
  pPVar2 = Pipeline::operator<<
                     (pPVar2,"Versions of qpdf prior to version 7 were released under the terms\n");
  pPVar2 = Pipeline::operator<<
                     (pPVar2,"of version 2.0 of the Artistic License. At your option, you may\n");
  pPVar2 = Pipeline::operator<<
                     (pPVar2,"continue to consider qpdf to be licensed under those terms. Please\n")
  ;
  Pipeline::operator<<(pPVar2,"see the manual for additional information.\n");
  std::__cxx11::string::~string((string *)&local_60);
  std::shared_ptr<Pipeline>::~shared_ptr((shared_ptr<Pipeline> *)&local_20);
  std::shared_ptr<QPDFLogger>::~shared_ptr(&local_30);
  return;
}

Assistant:

void
ArgParser::argCopyright()
{
    // clang-format off
    // Make sure the output looks right on an 80-column display.
    //               1         2         3         4         5         6         7         8
    //      12345678901234567890123456789012345678901234567890123456789012345678901234567890
    *QPDFLogger::defaultLogger()->getInfo()
        << this->ap.getProgname()
        << " version " << QPDF::QPDFVersion() << "\n"
        << "\n"
        << "Copyright (c) 2005-2021 Jay Berkenbilt\n"
        << "Copyright (c) 2022-2025 Jay Berkenbilt and Manfred Holger\n"
        << "\n"
        << "qpdf is licensed under the Apache License, Version 2.0 (the \"License\");\n"
        << "you may not use this file except in compliance with the License.\n"
        << "You may obtain a copy of the License at\n"
        << "\n"
        << "  http://www.apache.org/licenses/LICENSE-2.0\n"
        << "\n"
        << "Unless required by applicable law or agreed to in writing, software\n"
        << "distributed under the License is distributed on an \"AS IS\" BASIS,\n"
        << "WITHOUT WARRANTIES OR CONDITIONS OF ANY KIND, either express or implied.\n"
        << "See the License for the specific language governing permissions and\n"
        << "limitations under the License.\n"
        << "\n"
        << "Versions of qpdf prior to version 7 were released under the terms\n"
        << "of version 2.0 of the Artistic License. At your option, you may\n"
        << "continue to consider qpdf to be licensed under those terms. Please\n"
        << "see the manual for additional information.\n";
    // clang-format on
}